

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::RenderPassVkImpl::CreateRenderPass<1ul>(RenderPassVkImpl *this)

{
  Uint32 *pUVar1;
  allocator<VkAttachmentReference> *this_00;
  allocator<unsigned_int> *this_01;
  allocator<Diligent::RESOURCE_STATE> *this_02;
  SubpassDependencyDesc *pSVar2;
  uint uVar3;
  value_type vVar4;
  ShadingRateAttachment *pSrcAttachments;
  SubpassDesc *pSVar5;
  Uint32 UVar6;
  bool bVar7;
  VkFormat VVar8;
  VkAttachmentLoadOp VVar9;
  VkAttachmentStoreOp VVar10;
  VkImageLayout VVar11;
  VkPipelineStageFlags VVar12;
  VkAccessFlags VVar13;
  VulkanLogicalDevice *this_03;
  ExtensionFeatures *pEVar14;
  RenderPassAttachmentDesc *pRVar15;
  reference pvVar16;
  reference pvVar17;
  iterator __first;
  iterator __last;
  value_type *pvVar18;
  reference pvVar19;
  reference pvVar20;
  VkAttachmentReference2 *pVVar21;
  Char *pCVar22;
  char (*pacVar23) [60];
  char (*Args_1) [60];
  char (*pacVar24) [58];
  char (*Args_1_00) [58];
  VkRenderPass_T *pVVar25;
  SubpassDesc *Args_1_01;
  ulong __n;
  ShadingRateAttachment *local_380;
  RenderPassWrapper local_2b8;
  undefined4 local_2a0 [2];
  VkRenderPassFragmentDensityMapCreateInfoEXT FragDensityMapCI;
  value_type *vkDependency;
  SubpassDependencyDesc *DependencyDesc;
  Uint32 i_4;
  vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_> vkDependencies;
  string msg_2;
  string msg_1;
  SubpassDesc *SubpassDesc_1;
  undefined1 local_208 [4];
  Uint32 i_3;
  string msg;
  value_type *vkSRAttachment;
  ShadingRateAttachment *SRAttachment;
  undefined1 auStack_1c8 [4];
  Uint32 prsv_attachment;
  anon_class_32_4_53ae7d20 ConvertAttachmentReferences;
  anon_class_8_1_031e07a3 UpdateAttachmentsStates;
  value_type *vkSubpass;
  SubpassDesc *SubpassDesc;
  uint local_170;
  Uint32 SRInd;
  Uint32 i_2;
  vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> vkSubpasses;
  undefined1 local_148 [8];
  vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_> AttachmentStates;
  Uint32 CurrPreserveAttachmentInd;
  Uint32 CurrAttachmentReferenceInd;
  ShadingRateAttachment *pMainSRA;
  undefined1 local_118 [8];
  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  vkShadingRate;
  undefined1 local_f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vkPreserveAttachments;
  undefined1 local_d8 [8];
  vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> vkAttachmentReferences;
  SubpassDesc *Subpass;
  Uint32 i_1;
  Uint32 TotalShadingRateAttachmentsCount;
  Uint32 TotalPreserveAttachmentsCount;
  Uint32 TotalAttachmentReferencesCount;
  value_type *vkAttachment;
  RenderPassAttachmentDesc *Attachment;
  Uint32 i;
  allocator<VkAttachmentDescription> local_81;
  undefined1 local_80 [8];
  vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_> vkAttachments;
  RenderPassCIType RenderPassCI;
  bool FragDensityMapEnabled;
  bool ShadingRateEnabled;
  ExtensionFeatures *ExtFeats;
  VulkanLogicalDevice *LogicalDevice;
  RenderPassVkImpl *this_local;
  
  this_03 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                       .m_pDevice);
  pEVar14 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(this_03);
  RenderPassCI.pDependencies._7_1_ = (pEVar14->ShadingRate).attachmentFragmentShadingRate != 0;
  RenderPassCI.pDependencies._6_1_ = (pEVar14->FragmentDensityMap).fragmentDensityMap != 0;
  RenderPassCI.pSubpasses = (VkSubpassDescription *)0x0;
  RenderPassCI.dependencyCount = 0;
  RenderPassCI._52_4_ = 0;
  RenderPassCI.pAttachments = (VkAttachmentDescription *)0x0;
  RenderPassCI.subpassCount = 0;
  RenderPassCI._36_4_ = 0;
  RenderPassCI.flags = 0;
  RenderPassCI.attachmentCount = 0;
  vkAttachments.
  super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x26;
  RenderPassCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  RenderPassCI._4_4_ = 0;
  RenderPassCI.pNext = (void *)0x0;
  uVar3 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
          .m_Desc.AttachmentCount;
  std::allocator<VkAttachmentDescription>::allocator(&local_81);
  std::vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>::vector
            ((vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_> *)local_80,
             (ulong)uVar3,&local_81);
  std::allocator<VkAttachmentDescription>::~allocator(&local_81);
  for (Attachment._0_4_ = 0;
      (uint)Attachment <
      (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      .m_Desc.AttachmentCount; Attachment._0_4_ = (uint)Attachment + 1) {
    pRVar15 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
              .m_Desc.pAttachments + (uint)Attachment;
    pvVar16 = std::vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>::
              operator[]((vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>
                          *)local_80,(ulong)(uint)Attachment);
    InitAttachmentDescription(pvVar16);
    pvVar16->flags = 0;
    VVar8 = TexFormatToVkFormat(pRVar15->Format);
    pvVar16->format = VVar8;
    pvVar16->samples = (uint)pRVar15->SampleCount;
    VVar9 = AttachmentLoadOpToVkAttachmentLoadOp(pRVar15->LoadOp);
    pvVar16->loadOp = VVar9;
    VVar10 = AttachmentStoreOpToVkAttachmentStoreOp(pRVar15->StoreOp);
    pvVar16->storeOp = VVar10;
    VVar9 = AttachmentLoadOpToVkAttachmentLoadOp(pRVar15->StencilLoadOp);
    pvVar16->stencilLoadOp = VVar9;
    VVar10 = AttachmentStoreOpToVkAttachmentStoreOp(pRVar15->StencilStoreOp);
    pvVar16->stencilStoreOp = VVar10;
    VVar11 = ResourceStateToVkImageLayout
                       (pRVar15->InitialState,false,(bool)(RenderPassCI.pDependencies._6_1_ & 1));
    pvVar16->initialLayout = VVar11;
    VVar11 = ResourceStateToVkImageLayout
                       (pRVar15->FinalState,true,(bool)(RenderPassCI.pDependencies._6_1_ & 1));
    pvVar16->finalLayout = VVar11;
  }
  RenderPassCI.pNext =
       (void *)CONCAT44((this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                        .m_Desc.AttachmentCount,RenderPassCI.pNext._0_4_);
  RenderPassCI._16_8_ =
       std::vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>::data
                 ((vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_> *)
                  local_80);
  TotalShadingRateAttachmentsCount = 0;
  i_1 = 0;
  Subpass._4_4_ = 0;
  for (Subpass._0_4_ = 0;
      (uint)Subpass <
      (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount; Subpass._0_4_ = (uint)Subpass + 1) {
    vkAttachmentReferences.
    super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                   .m_Desc.pSubpasses + (uint)Subpass);
    TotalShadingRateAttachmentsCount =
         ((SubpassDesc *)
         vkAttachmentReferences.
         super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->RenderTargetAttachmentCount +
         ((SubpassDesc *)
         vkAttachmentReferences.
         super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->InputAttachmentCount +
         TotalShadingRateAttachmentsCount;
    if (((SubpassDesc *)
        vkAttachmentReferences.
        super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->pResolveAttachments !=
        (AttachmentReference *)0x0) {
      TotalShadingRateAttachmentsCount =
           ((SubpassDesc *)
           vkAttachmentReferences.
           super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage)->RenderTargetAttachmentCount +
           TotalShadingRateAttachmentsCount;
    }
    if (((SubpassDesc *)
        vkAttachmentReferences.
        super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->pDepthStencilAttachment !=
        (AttachmentReference *)0x0) {
      TotalShadingRateAttachmentsCount = TotalShadingRateAttachmentsCount + 1;
    }
    if ((((SubpassDesc *)
         vkAttachmentReferences.
         super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->pShadingRateAttachment !=
         (ShadingRateAttachment *)0x0) && ((RenderPassCI.pDependencies._7_1_ & 1) != 0)) {
      Subpass._4_4_ = Subpass._4_4_ + 1;
    }
    i_1 = ((SubpassDesc *)
          vkAttachmentReferences.
          super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->PreserveAttachmentCount + i_1;
  }
  this_00 = (allocator<VkAttachmentReference> *)
            ((long)&vkPreserveAttachments.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<VkAttachmentReference>::allocator(this_00);
  std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::vector
            ((vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)local_d8,
             (ulong)TotalShadingRateAttachmentsCount + (ulong)Subpass._4_4_,this_00);
  std::allocator<VkAttachmentReference>::~allocator
            ((allocator<VkAttachmentReference> *)
             ((long)&vkPreserveAttachments.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  this_01 = (allocator<unsigned_int> *)
            ((long)&vkShadingRate.
                    super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_01);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,(ulong)i_1,this_01);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&vkShadingRate.
                     super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<VkFragmentShadingRateAttachmentInfoKHR>::allocator
            ((allocator<VkFragmentShadingRateAttachmentInfoKHR> *)((long)&pMainSRA + 7));
  std::
  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  ::vector((vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
            *)local_118,(ulong)Subpass._4_4_,
           (allocator<VkFragmentShadingRateAttachmentInfoKHR> *)((long)&pMainSRA + 7));
  std::allocator<VkFragmentShadingRateAttachmentInfoKHR>::~allocator
            ((allocator<VkFragmentShadingRateAttachmentInfoKHR> *)((long)&pMainSRA + 7));
  _CurrPreserveAttachmentInd = (ShadingRateAttachment *)0x0;
  AttachmentStates.
  super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  AttachmentStates.
  super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  uVar3 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
          .m_Desc.AttachmentCount;
  this_02 = (allocator<Diligent::RESOURCE_STATE> *)
            ((long)&vkSubpasses.
                    super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Diligent::RESOURCE_STATE>::allocator(this_02);
  std::vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>::vector
            ((vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_> *)
             local_148,(ulong)uVar3,this_02);
  std::allocator<Diligent::RESOURCE_STATE>::~allocator
            ((allocator<Diligent::RESOURCE_STATE> *)
             ((long)&vkSubpasses.
                     super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar3 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
          .m_Desc.SubpassCount;
  std::allocator<VkSubpassDescription>::allocator
            ((allocator<VkSubpassDescription> *)((long)&SRInd + 3));
  std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::vector
            ((vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> *)&i_2,
             (ulong)uVar3,(allocator<VkSubpassDescription> *)((long)&SRInd + 3));
  std::allocator<VkSubpassDescription>::~allocator
            ((allocator<VkSubpassDescription> *)((long)&SRInd + 3));
  SubpassDesc._4_4_ = 0;
  for (local_170 = 0;
      local_170 <
      (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount; local_170 = local_170 + 1) {
    pSVar5 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_Desc.pSubpasses + local_170;
    pvVar17 = std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::operator[]
                        ((vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> *)&i_2
                         ,(ulong)local_170);
    InitSubpassDescription(pvVar17);
    pvVar17->flags = 0;
    pvVar17->pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    __first = std::vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>::
              begin((vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_> *)
                    local_148);
    __last = std::vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>::end
                       ((vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                         *)local_148);
    UpdateAttachmentsStates.AttachmentStates._4_4_ = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<Diligent::RESOURCE_STATE*,std::vector<Diligent::RESOURCE_STATE,std::allocator<Diligent::RESOURCE_STATE>>>,Diligent::RESOURCE_STATE>
              ((__normal_iterator<Diligent::RESOURCE_STATE_*,_std::vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>_>
                )__first._M_current,
               (__normal_iterator<Diligent::RESOURCE_STATE_*,_std::vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>_>
                )__last._M_current,
               (RESOURCE_STATE *)((long)&UpdateAttachmentsStates.AttachmentStates + 4));
    ConvertAttachmentReferences.FragDensityMapEnabled = (bool *)local_148;
    CreateRenderPass<1UL>::anon_class_8_1_031e07a3::operator()
              ((anon_class_8_1_031e07a3 *)&ConvertAttachmentReferences.FragDensityMapEnabled,
               pSVar5->InputAttachmentCount,pSVar5->pInputAttachments);
    CreateRenderPass<1UL>::anon_class_8_1_031e07a3::operator()
              ((anon_class_8_1_031e07a3 *)&ConvertAttachmentReferences.FragDensityMapEnabled,
               pSVar5->RenderTargetAttachmentCount,pSVar5->pRenderTargetAttachments);
    CreateRenderPass<1UL>::anon_class_8_1_031e07a3::operator()
              ((anon_class_8_1_031e07a3 *)&ConvertAttachmentReferences.FragDensityMapEnabled,1,
               pSVar5->pDepthStencilAttachment);
    _auStack_1c8 = (vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)local_d8
    ;
    ConvertAttachmentReferences.vkAttachmentReferences =
         (vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)
         ((long)&AttachmentStates.
                 super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    ConvertAttachmentReferences.CurrAttachmentReferenceInd = (Uint32 *)local_148;
    ConvertAttachmentReferences.AttachmentStates =
         (vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_> *)
         ((long)&RenderPassCI.pDependencies + 6);
    pvVar17->inputAttachmentCount = pSVar5->InputAttachmentCount;
    if (pSVar5->InputAttachmentCount != 0) {
      pvVar18 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                          ((anon_class_32_4_53ae7d20 *)auStack_1c8,pSVar5->InputAttachmentCount,
                           pSVar5->pInputAttachments,1);
      pvVar17->pInputAttachments = pvVar18;
    }
    pvVar17->colorAttachmentCount = pSVar5->RenderTargetAttachmentCount;
    if (pSVar5->RenderTargetAttachmentCount != 0) {
      pvVar18 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                          ((anon_class_32_4_53ae7d20 *)auStack_1c8,
                           pSVar5->RenderTargetAttachmentCount,pSVar5->pRenderTargetAttachments,1);
      pvVar17->pColorAttachments = pvVar18;
      if (pSVar5->pResolveAttachments != (AttachmentReference *)0x0) {
        pvVar18 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                            ((anon_class_32_4_53ae7d20 *)auStack_1c8,
                             pSVar5->RenderTargetAttachmentCount,pSVar5->pResolveAttachments,1);
        pvVar17->pResolveAttachments = pvVar18;
      }
    }
    if (pSVar5->pDepthStencilAttachment != (AttachmentReference *)0x0) {
      pvVar18 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                          ((anon_class_32_4_53ae7d20 *)auStack_1c8,1,pSVar5->pDepthStencilAttachment
                           ,6);
      pvVar17->pDepthStencilAttachment = pvVar18;
    }
    uVar3 = pSVar5->PreserveAttachmentCount;
    pvVar17->preserveAttachmentCount = uVar3;
    Args_1_01 = (SubpassDesc *)(ulong)uVar3;
    if (pSVar5->PreserveAttachmentCount != 0) {
      pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,
                           (ulong)(uint)AttachmentStates.
                                        super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar17->pPreserveAttachments = pvVar19;
      for (SRAttachment._4_4_ = 0; Args_1_01 = pSVar5,
          SRAttachment._4_4_ < pSVar5->PreserveAttachmentCount;
          SRAttachment._4_4_ = SRAttachment._4_4_ + 1) {
        vVar4 = pSVar5->pPreserveAttachments[SRAttachment._4_4_];
        pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,
                             (ulong)(uint)AttachmentStates.
                                          super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *pvVar19 = vVar4;
        AttachmentStates.
        super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)AttachmentStates.
                   super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      }
    }
    if (pSVar5->pShadingRateAttachment != (ShadingRateAttachment *)0x0) {
      if ((RenderPassCI.pDependencies._7_1_ & 1) == 0) {
        if ((RenderPassCI.pDependencies._6_1_ & 1) == 0) {
          FormatString<char[26],char[22]>
                    ((string *)local_208,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"FragDensityMapEnabled",(char (*) [22])Args_1_01);
          pCVar22 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar22,"CreateRenderPass",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                     ,0x11b);
          std::__cxx11::string::~string((string *)local_208);
        }
        if (_CurrPreserveAttachmentInd == (ShadingRateAttachment *)0x0) {
          local_380 = pSVar5->pShadingRateAttachment;
        }
        else {
          local_380 = _CurrPreserveAttachmentInd;
        }
        _CurrPreserveAttachmentInd = local_380;
      }
      else {
        pSrcAttachments = pSVar5->pShadingRateAttachment;
        __n = (ulong)SubpassDesc._4_4_;
        SubpassDesc._4_4_ = SubpassDesc._4_4_ + 1;
        pvVar20 = std::
                  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
                  ::operator[]((vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
                                *)local_118,__n);
        SetSubpassDescriptionNext(pvVar17,pvVar20);
        pvVar20->pNext = (void *)0x0;
        pvVar20->sType = VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR;
        pVVar21 = (VkAttachmentReference2 *)
                  CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                            ((anon_class_32_4_53ae7d20 *)auStack_1c8,1,&pSrcAttachments->Attachment,
                             1);
        pvVar20->pFragmentShadingRateAttachment = pVVar21;
        pUVar1 = pSrcAttachments->TileSize;
        msg.field_2._8_4_ = *pUVar1;
        msg.field_2._12_4_ = pSrcAttachments->TileSize[1];
        UVar6 = pUVar1[1];
        (pvVar20->shadingRateAttachmentTexelSize).width = pUVar1[0];
        (pvVar20->shadingRateAttachmentTexelSize).height = UVar6;
      }
    }
  }
  if (((RenderPassCI.pDependencies._6_1_ & 1) != 0) &&
     (_CurrPreserveAttachmentInd != (ShadingRateAttachment *)0x0)) {
    for (SubpassDesc_1._4_4_ = 0;
        SubpassDesc_1._4_4_ <
        (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.SubpassCount; SubpassDesc_1._4_4_ = SubpassDesc_1._4_4_ + 1) {
      pSVar5 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
               .m_Desc.pSubpasses;
      if (pSVar5[SubpassDesc_1._4_4_].pShadingRateAttachment == (ShadingRateAttachment *)0x0) {
        LogError<true,char[107]>
                  (false,"CreateRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                   ,0x128,(char (*) [107])
                          "Vk_EXT_fragment_density_map extension requires that shading rate attachment is specified for all subpasses"
                  );
      }
      bVar7 = ShadingRateAttachment::operator!=
                        (_CurrPreserveAttachmentInd,
                         pSVar5[SubpassDesc_1._4_4_].pShadingRateAttachment);
      if (bVar7) {
        LogError<true,char[106]>
                  (false,"CreateRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                   ,299,(char (*) [106])
                        "Vk_EXT_fragment_density_map extension requires that shading rate attachment is the same for all subpasses"
                  );
      }
    }
  }
  pacVar23 = (char (*) [60])
             (ulong)AttachmentStates.
                    super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  Args_1 = (char (*) [60])
           std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::size
                     ((vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)
                      local_d8);
  if (pacVar23 != Args_1) {
    FormatString<char[26],char[60]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrAttachmentReferenceInd == vkAttachmentReferences.size()",Args_1);
    pCVar22 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar22,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x12f);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  pacVar24 = (char (*) [58])
             (ulong)(uint)AttachmentStates.
                          super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Args_1_00 = (char (*) [58])
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  if (pacVar24 != Args_1_00) {
    FormatString<char[26],char[58]>
              ((string *)
               &vkDependencies.
                super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrPreserveAttachmentInd == vkPreserveAttachments.size()",Args_1_00)
    ;
    pCVar22 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar22,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x130);
    std::__cxx11::string::~string
              ((string *)
               &vkDependencies.
                super__Vector_base<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  RenderPassCI.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(RenderPassCI.pAttachments._4_4_,
                (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                .m_Desc.SubpassCount);
  RenderPassCI._32_8_ =
       std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::data
                 ((vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> *)&i_2);
  uVar3 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
          .m_Desc.DependencyCount;
  std::allocator<VkSubpassDependency>::allocator
            ((allocator<VkSubpassDependency> *)((long)&DependencyDesc + 7));
  std::vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>::vector
            ((vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_> *)&i_4,(ulong)uVar3,
             (allocator<VkSubpassDependency> *)((long)&DependencyDesc + 7));
  std::allocator<VkSubpassDependency>::~allocator
            ((allocator<VkSubpassDependency> *)((long)&DependencyDesc + 7));
  for (DependencyDesc._0_4_ = 0;
      (uint)DependencyDesc <
      (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      .m_Desc.DependencyCount; DependencyDesc._0_4_ = (uint)DependencyDesc + 1) {
    pSVar2 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_Desc.pDependencies + (uint)DependencyDesc;
    FragDensityMapCI.fragmentDensityMapAttachment =
         (VkAttachmentReference)
         std::vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>::operator[]
                   ((vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_> *)&i_4,
                    (ulong)(uint)DependencyDesc);
    InitSubpassDependency((VkSubpassDependency *)FragDensityMapCI.fragmentDensityMapAttachment);
    *(Uint32 *)FragDensityMapCI.fragmentDensityMapAttachment = pSVar2->SrcSubpass;
    *(Uint32 *)((long)FragDensityMapCI.fragmentDensityMapAttachment + 4) = pSVar2->DstSubpass;
    VVar12 = PipelineStageFlagsToVkPipelineStageFlags(pSVar2->SrcStageMask);
    *(VkPipelineStageFlags *)((long)FragDensityMapCI.fragmentDensityMapAttachment + 8) = VVar12;
    VVar12 = PipelineStageFlagsToVkPipelineStageFlags(pSVar2->DstStageMask);
    *(VkPipelineStageFlags *)((long)FragDensityMapCI.fragmentDensityMapAttachment + 0xc) = VVar12;
    VVar13 = AccessFlagsToVkAccessFlags(pSVar2->SrcAccessMask);
    *(VkAccessFlags *)((long)FragDensityMapCI.fragmentDensityMapAttachment + 0x10) = VVar13;
    VVar13 = AccessFlagsToVkAccessFlags(pSVar2->DstAccessMask);
    *(VkAccessFlags *)((long)FragDensityMapCI.fragmentDensityMapAttachment + 0x14) = VVar13;
    *(undefined4 *)((long)FragDensityMapCI.fragmentDensityMapAttachment + 0x18) = 1;
  }
  RenderPassCI.pSubpasses =
       (VkSubpassDescription *)
       CONCAT44(RenderPassCI.pSubpasses._4_4_,
                (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                .m_Desc.DependencyCount);
  RenderPassCI._48_8_ =
       std::vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>::data
                 ((vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_> *)&i_4);
  memset(local_2a0,0,0x18);
  if (((RenderPassCI.pDependencies._6_1_ & 1) != 0) &&
     (_CurrPreserveAttachmentInd != (ShadingRateAttachment *)0x0)) {
    RenderPassCI._0_8_ = local_2a0;
    local_2a0[0] = 0x3b9e1d92;
    FragDensityMapCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    FragDensityMapCI._4_4_ = 0;
    FragDensityMapCI.pNext._0_4_ = (_CurrPreserveAttachmentInd->Attachment).AttachmentIndex;
    FragDensityMapCI.pNext._4_4_ = 0x3b9e1d90;
  }
  VulkanUtilities::VulkanLogicalDevice::CreateRenderPass
            (&local_2b8,this_03,
             (VkRenderPassCreateInfo *)
             &vkAttachments.
              super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8>::
  operator=(&this->m_VkRenderPass,&local_2b8);
  VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8>::
  ~VulkanObjectWrapper(&local_2b8);
  pVVar25 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkRenderPass_T_
                      ((VulkanObjectWrapper *)&this->m_VkRenderPass);
  if (pVVar25 == (VkRenderPass_T *)0x0) {
    LogError<true,char[36]>
              (false,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x15c,(char (*) [36])"Failed to create Vulkan render pass");
  }
  std::vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>::~vector
            ((vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_> *)&i_4);
  std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::~vector
            ((vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> *)&i_2);
  std::vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>::~vector
            ((vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_> *)
             local_148);
  std::
  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  ::~vector((vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
             *)local_118);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::~vector
            ((vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)local_d8);
  std::vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>::~vector
            ((vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_> *)local_80);
  return;
}

Assistant:

void RenderPassVkImpl::CreateRenderPass() noexcept(false)
{
    using RenderPassCIType          = std::conditional_t<RPVersion == 2, VkRenderPassCreateInfo2, VkRenderPassCreateInfo>;
    using SubpassDescriptionType    = std::conditional_t<RPVersion == 2, VkSubpassDescription2, VkSubpassDescription>;
    using AttachmentDescriptionType = std::conditional_t<RPVersion == 2, VkAttachmentDescription2, VkAttachmentDescription>;
    using AttachmentReferenceType   = std::conditional_t<RPVersion == 2, VkAttachmentReference2, VkAttachmentReference>;
    using SubpassDependencyType     = std::conditional_t<RPVersion == 2, VkSubpassDependency2, VkSubpassDependency>;

    const auto& LogicalDevice         = m_pDevice->GetLogicalDevice();
    const auto& ExtFeats              = LogicalDevice.GetEnabledExtFeatures();
    const bool  ShadingRateEnabled    = ExtFeats.ShadingRate.attachmentFragmentShadingRate != VK_FALSE;
    const bool  FragDensityMapEnabled = ExtFeats.FragmentDensityMap.fragmentDensityMap != VK_FALSE;

    RenderPassCIType RenderPassCI{};
    RenderPassCI.sType = RPVersion == 2 ? VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2 : VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    RenderPassCI.pNext = nullptr;
    RenderPassCI.flags = 0;

    std::vector<AttachmentDescriptionType> vkAttachments(m_Desc.AttachmentCount);
    for (Uint32 i = 0; i < m_Desc.AttachmentCount; ++i)
    {
        const auto& Attachment   = m_Desc.pAttachments[i];
        auto&       vkAttachment = vkAttachments[i];

        InitAttachmentDescription(vkAttachment);
        vkAttachment.flags          = 0;
        vkAttachment.format         = TexFormatToVkFormat(Attachment.Format);
        vkAttachment.samples        = static_cast<VkSampleCountFlagBits>(Attachment.SampleCount);
        vkAttachment.loadOp         = AttachmentLoadOpToVkAttachmentLoadOp(Attachment.LoadOp);
        vkAttachment.storeOp        = AttachmentStoreOpToVkAttachmentStoreOp(Attachment.StoreOp);
        vkAttachment.stencilLoadOp  = AttachmentLoadOpToVkAttachmentLoadOp(Attachment.StencilLoadOp);
        vkAttachment.stencilStoreOp = AttachmentStoreOpToVkAttachmentStoreOp(Attachment.StencilStoreOp);
        vkAttachment.initialLayout  = ResourceStateToVkImageLayout(Attachment.InitialState, /*IsInsideRenderPass = */ false, FragDensityMapEnabled);
        vkAttachment.finalLayout    = ResourceStateToVkImageLayout(Attachment.FinalState, /*IsInsideRenderPass = */ true, FragDensityMapEnabled);
    }
    RenderPassCI.attachmentCount = m_Desc.AttachmentCount;
    RenderPassCI.pAttachments    = vkAttachments.data();

    Uint32 TotalAttachmentReferencesCount   = 0;
    Uint32 TotalPreserveAttachmentsCount    = 0;
    Uint32 TotalShadingRateAttachmentsCount = 0;
    for (Uint32 i = 0; i < m_Desc.SubpassCount; ++i)
    {
        const auto& Subpass = m_Desc.pSubpasses[i];
        TotalAttachmentReferencesCount += Subpass.InputAttachmentCount;
        TotalAttachmentReferencesCount += Subpass.RenderTargetAttachmentCount;
        if (Subpass.pResolveAttachments != nullptr)
            TotalAttachmentReferencesCount += Subpass.RenderTargetAttachmentCount;
        if (Subpass.pDepthStencilAttachment != nullptr)
            TotalAttachmentReferencesCount += 1;
        if (Subpass.pShadingRateAttachment != nullptr && ShadingRateEnabled)
            TotalShadingRateAttachmentsCount += 1;
        TotalPreserveAttachmentsCount += Subpass.PreserveAttachmentCount;
    }

    std::vector<AttachmentReferenceType>                vkAttachmentReferences(size_t{TotalAttachmentReferencesCount} + size_t{TotalShadingRateAttachmentsCount});
    std::vector<Uint32>                                 vkPreserveAttachments(TotalPreserveAttachmentsCount);
    std::vector<VkFragmentShadingRateAttachmentInfoKHR> vkShadingRate{TotalShadingRateAttachmentsCount};
    const ShadingRateAttachment*                        pMainSRA = nullptr;

    Uint32 CurrAttachmentReferenceInd = 0;
    Uint32 CurrPreserveAttachmentInd  = 0;

    // State flags for every attachment in each subpass.
    // This array is used to detect attachments that are used as render target or depth-stencil,
    // but also as input attachment in the same subpass. Such attachments need to use GENERAL layout.
    std::vector<RESOURCE_STATE> AttachmentStates(m_Desc.AttachmentCount);

    std::vector<SubpassDescriptionType> vkSubpasses(m_Desc.SubpassCount);
    for (Uint32 i = 0, SRInd = 0; i < m_Desc.SubpassCount; ++i)
    {
        const auto& SubpassDesc = m_Desc.pSubpasses[i];
        auto&       vkSubpass   = vkSubpasses[i];

        InitSubpassDescription(vkSubpass);
        vkSubpass.flags             = 0;
        vkSubpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;

        std::fill(AttachmentStates.begin(), AttachmentStates.end(), RESOURCE_STATE_UNKNOWN);
        auto UpdateAttachmentsStates = [&AttachmentStates](Uint32 NumAttachments, const AttachmentReference* pSrcAttachments) //
        {
            if (pSrcAttachments == nullptr)
                return;
            for (Uint32 attachment = 0; attachment < NumAttachments; ++attachment)
            {
                const auto& SrcAttachmentRef = pSrcAttachments[attachment];
                if (SrcAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                    AttachmentStates[SrcAttachmentRef.AttachmentIndex] |= SrcAttachmentRef.State;
            }
        };
        UpdateAttachmentsStates(SubpassDesc.InputAttachmentCount, SubpassDesc.pInputAttachments);
        UpdateAttachmentsStates(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pRenderTargetAttachments);
        UpdateAttachmentsStates(1, SubpassDesc.pDepthStencilAttachment);

        auto ConvertAttachmentReferences = [&](Uint32 NumAttachments, const AttachmentReference* pSrcAttachments, VkImageAspectFlags AspectMask) //
        {
            auto* pCurrVkAttachmentReference = &vkAttachmentReferences[CurrAttachmentReferenceInd];
            for (Uint32 attachment = 0; attachment < NumAttachments; ++attachment, ++CurrAttachmentReferenceInd)
            {
                const auto& SrcAttachmentRef = pSrcAttachments[attachment];
                auto&       DstAttachmentRef = vkAttachmentReferences[CurrAttachmentReferenceInd];

                InitAttachmentReference(DstAttachmentRef, AspectMask);
                DstAttachmentRef.attachment = SrcAttachmentRef.AttachmentIndex;

                auto State = SrcAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED ?
                    AttachmentStates[SrcAttachmentRef.AttachmentIndex] :
                    SrcAttachmentRef.State;
                if (PlatformMisc::CountOneBits(State) >= 2)
                {
                    // The same attachment is used in different ways in this subpass (e.g. color and input attachments).
                    // It must use COMMON layout.
                    State = RESOURCE_STATE_COMMON;
                }
                else
                {
                    VERIFY_EXPR(State == RESOURCE_STATE_UNKNOWN || State == SrcAttachmentRef.State);
                    State = SrcAttachmentRef.State;
                }

                DstAttachmentRef.layout = ResourceStateToVkImageLayout(State, /*IsInsideRenderPass = */ true, FragDensityMapEnabled);
            }
            return pCurrVkAttachmentReference;
        };

        vkSubpass.inputAttachmentCount = SubpassDesc.InputAttachmentCount;
        if (SubpassDesc.InputAttachmentCount != 0)
        {
            vkSubpass.pInputAttachments = ConvertAttachmentReferences(SubpassDesc.InputAttachmentCount, SubpassDesc.pInputAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
        }

        vkSubpass.colorAttachmentCount = SubpassDesc.RenderTargetAttachmentCount;
        if (SubpassDesc.RenderTargetAttachmentCount != 0)
        {
            vkSubpass.pColorAttachments = ConvertAttachmentReferences(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pRenderTargetAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
            if (SubpassDesc.pResolveAttachments != nullptr)
            {
                vkSubpass.pResolveAttachments = ConvertAttachmentReferences(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pResolveAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr)
        {
            vkSubpass.pDepthStencilAttachment = ConvertAttachmentReferences(1, SubpassDesc.pDepthStencilAttachment, VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT);
        }

        vkSubpass.preserveAttachmentCount = SubpassDesc.PreserveAttachmentCount;
        if (SubpassDesc.PreserveAttachmentCount != 0)
        {
            vkSubpass.pPreserveAttachments = &vkPreserveAttachments[CurrPreserveAttachmentInd];
            for (Uint32 prsv_attachment = 0; prsv_attachment < SubpassDesc.PreserveAttachmentCount; ++prsv_attachment, ++CurrPreserveAttachmentInd)
            {
                vkPreserveAttachments[CurrPreserveAttachmentInd] = SubpassDesc.pPreserveAttachments[prsv_attachment];
            }
        }

        if (SubpassDesc.pShadingRateAttachment != nullptr)
        {
            if (ShadingRateEnabled)
            {
                const auto& SRAttachment   = *SubpassDesc.pShadingRateAttachment;
                auto&       vkSRAttachment = vkShadingRate[SRInd++];

                SetSubpassDescriptionNext(vkSubpass, &vkSRAttachment);
                vkSRAttachment.pNext                          = nullptr;
                vkSRAttachment.sType                          = VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR;
                vkSRAttachment.pFragmentShadingRateAttachment = reinterpret_cast<const VkAttachmentReference2*>(ConvertAttachmentReferences(1, &SRAttachment.Attachment, VK_IMAGE_ASPECT_COLOR_BIT));
                vkSRAttachment.shadingRateAttachmentTexelSize = {SRAttachment.TileSize[0], SRAttachment.TileSize[1]};
            }
            else
            {
                VERIFY_EXPR(FragDensityMapEnabled);
                pMainSRA = pMainSRA ? pMainSRA : SubpassDesc.pShadingRateAttachment;
            }
        }
    }

    if (FragDensityMapEnabled && pMainSRA != nullptr)
    {
        for (Uint32 i = 0; i < m_Desc.SubpassCount; ++i)
        {
            const auto& SubpassDesc = m_Desc.pSubpasses[i];

            if (SubpassDesc.pShadingRateAttachment == nullptr)
                LOG_ERROR_AND_THROW("Vk_EXT_fragment_density_map extension requires that shading rate attachment is specified for all subpasses");

            if (*pMainSRA != *SubpassDesc.pShadingRateAttachment)
                LOG_ERROR_AND_THROW("Vk_EXT_fragment_density_map extension requires that shading rate attachment is the same for all subpasses");
        }
    }

    VERIFY_EXPR(CurrAttachmentReferenceInd == vkAttachmentReferences.size());
    VERIFY_EXPR(CurrPreserveAttachmentInd == vkPreserveAttachments.size());
    RenderPassCI.subpassCount = m_Desc.SubpassCount;
    RenderPassCI.pSubpasses   = vkSubpasses.data();

    std::vector<SubpassDependencyType> vkDependencies(m_Desc.DependencyCount);
    for (Uint32 i = 0; i < m_Desc.DependencyCount; ++i)
    {
        const auto& DependencyDesc = m_Desc.pDependencies[i];
        auto&       vkDependency   = vkDependencies[i];

        InitSubpassDependency(vkDependency);
        vkDependency.srcSubpass    = DependencyDesc.SrcSubpass;
        vkDependency.dstSubpass    = DependencyDesc.DstSubpass;
        vkDependency.srcStageMask  = PipelineStageFlagsToVkPipelineStageFlags(DependencyDesc.SrcStageMask);
        vkDependency.dstStageMask  = PipelineStageFlagsToVkPipelineStageFlags(DependencyDesc.DstStageMask);
        vkDependency.srcAccessMask = AccessFlagsToVkAccessFlags(DependencyDesc.SrcAccessMask);
        vkDependency.dstAccessMask = AccessFlagsToVkAccessFlags(DependencyDesc.DstAccessMask);

        // VK_DEPENDENCY_BY_REGION_BIT specifies that dependencies will be framebuffer-local.
        // Framebuffer-local dependencies are more optimal for most architectures; particularly
        // tile-based architectures - which can keep framebuffer-regions entirely in on-chip registers
        // and thus avoid external bandwidth across such a dependency. Including a framebuffer-global
        // dependency in your rendering will usually force all implementations to flush data to memory,
        // or to a higher level cache, breaking any potential locality optimizations.
        vkDependency.dependencyFlags = VK_DEPENDENCY_BY_REGION_BIT;
    }
    RenderPassCI.dependencyCount = m_Desc.DependencyCount;
    RenderPassCI.pDependencies   = vkDependencies.data();

    // Enable fragment density map
    VkRenderPassFragmentDensityMapCreateInfoEXT FragDensityMapCI{};
    if (FragDensityMapEnabled && pMainSRA != nullptr)
    {
        RenderPassCI.pNext     = &FragDensityMapCI;
        FragDensityMapCI.sType = VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT;
        FragDensityMapCI.pNext = nullptr;

        FragDensityMapCI.fragmentDensityMapAttachment.attachment = pMainSRA->Attachment.AttachmentIndex;
        FragDensityMapCI.fragmentDensityMapAttachment.layout     = VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
    }

    m_VkRenderPass = LogicalDevice.CreateRenderPass(RenderPassCI, m_Desc.Name);
    if (!m_VkRenderPass)
    {
        LOG_ERROR_AND_THROW("Failed to create Vulkan render pass");
    }
}